

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O3

void __thiscall MutexLocker::~MutexLocker(MutexLocker *this)

{
  Mutex *pMVar1;
  MutexFactory *pMVar2;
  
  this->_vptr_MutexLocker = (_func_int **)&PTR__MutexLocker_0019afd8;
  pMVar1 = this->mutex;
  if ((pMVar1 != (Mutex *)0x0) && (pMVar1->isValid == true)) {
    pMVar2 = MutexFactory::i();
    if (pMVar2->enabled == true) {
      (*pMVar2->unlockMutex)(pMVar1->handle);
    }
  }
  return;
}

Assistant:

MutexLocker::~MutexLocker()
{
	if (mutex != NULL) mutex->unlock();
}